

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

VariableSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,VariableLifetime *args_2)

{
  bitmask<slang::ast::DeclaredTypeFlags> *pbVar1;
  VariableLifetime VVar2;
  string_view name;
  VariableSymbol *this_00;
  
  this_00 = (VariableSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((VariableSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (VariableSymbol *)allocateSlow(this,0x158,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  VVar2 = *args_2;
  ast::ValueSymbol::ValueSymbol
            (&this_00->super_ValueSymbol,Variable,name,*args_1,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  this_00->lifetime = VVar2;
  (this_00->flags).m_bits = 0;
  if (VVar2 == Automatic) {
    pbVar1 = &(this_00->super_ValueSymbol).declaredType.flags;
    *(byte *)&pbVar1->m_bits = (byte)pbVar1->m_bits | 0x10;
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }